

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

Vec_Int_t * Unm_ManFindUsedNodes(Vec_Int_t *vPairs,int nObjs)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  void *__s;
  ulong uVar3;
  int i;
  ulong uVar4;
  
  p = Vec_IntAlloc(1000);
  iVar1 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar1 = nObjs;
  }
  i = 0;
  if (iVar1 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar1);
  }
  memset(__s,0,(long)nObjs);
  while( true ) {
    if (vPairs->nSize <= i) {
      uVar3 = 0;
      uVar4 = (ulong)(uint)nObjs;
      if (nObjs < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        if (*(char *)((long)__s + uVar3) != '\0') {
          Vec_IntPush(p,(int)uVar3);
        }
      }
      free(__s);
      printf("The number of used nodes = %d\n",(ulong)(uint)p->nSize);
      return p;
    }
    uVar2 = Vec_IntEntry(vPairs,i);
    if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) break;
    *(undefined1 *)((long)__s + (ulong)uVar2) = 1;
    i = i + 3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
}

Assistant:

Vec_Int_t * Unm_ManFindUsedNodes( Vec_Int_t * vPairs, int nObjs )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Str_t * vMarks = Vec_StrStart( nObjs ); int i;
    for ( i = 0; i < Vec_IntSize(vPairs); i += 3 )
        Vec_StrWriteEntry( vMarks, Vec_IntEntry(vPairs, i), 1 );
    for ( i = 0; i < nObjs; i++ )
        if ( Vec_StrEntry( vMarks, i ) )
            Vec_IntPush( vNodes, i );
    Vec_StrFree( vMarks );
    printf( "The number of used nodes = %d\n", Vec_IntSize(vNodes) );
    return vNodes;
}